

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O1

void __thiscall
QAbstractItemModelTesterPrivate::rowsAboutToBeInserted
          (QAbstractItemModelTesterPrivate *this,QModelIndex *parent,int start,int end)

{
  Data *pDVar1;
  QObject *pQVar2;
  QAbstractItemModel *pQVar3;
  QDebug QVar4;
  bool bVar5;
  int iVar6;
  QObject *pQVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  Changing c;
  undefined1 local_150 [24];
  undefined1 local_138 [24];
  QArrayData *local_120;
  undefined8 *local_118;
  QDebug local_108;
  undefined1 local_100 [8];
  QDebug local_f8;
  QModelIndex local_f0;
  undefined1 local_d8 [32];
  anon_union_24_3_e3d07ef4_for_data local_b8;
  undefined8 uStack_a0;
  anon_union_24_3_e3d07ef4_for_data local_98;
  undefined8 uStack_80;
  anon_union_24_3_e3d07ef4_for_data local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8._0_4_ = None;
  bVar5 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (this,&this->changeInFlight,(ChangeInFlight *)local_d8,"changeInFlight",
                     "ChangeInFlight::None",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x330);
  if (!bVar5) goto LAB_00149eb1;
  this->changeInFlight = RowsInserted;
  lcModelTest();
  if (((byte)lcModelTest::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_d8._0_4_ = ColumnsMoved;
    local_d8._4_4_ = 0;
    local_d8._8_4_ = 0;
    local_d8._12_4_ = 0;
    local_d8._16_4_ = 0;
    local_d8._20_4_ = 0;
    local_d8._24_8_ = lcModelTest::category.name;
    QMessageLogger::debug();
    QVar4.stream = local_108.stream;
    QVar8.m_data = (storage_type *)0x15;
    QVar8.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    if (*(QTextStream *)(local_108.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_108.stream,' ');
    }
    QVar4.stream = local_108.stream;
    QVar9.m_data = (storage_type *)0x6;
    QVar9.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar9);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    if (*(QTextStream *)(local_108.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_108.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_108.stream,start);
    if (*(QTextStream *)(local_108.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_108.stream,' ');
    }
    QVar4.stream = local_108.stream;
    QVar10.m_data = (storage_type *)0x4;
    QVar10.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar10);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    if (*(QTextStream *)(local_108.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_108.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_108.stream,end);
    if (*(QTextStream *)(local_108.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_108.stream,' ');
    }
    QVar4.stream = local_108.stream;
    QVar11.m_data = (storage_type *)0x7;
    QVar11.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar11);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    if (*(QTextStream *)(local_108.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_108.stream,' ');
    }
    local_100 = (undefined1  [8])local_108.stream;
    *(int *)(local_108.stream + 0x28) = *(int *)(local_108.stream + 0x28) + 1;
    operator<<((Stream *)(local_100 + 8),(QModelIndex *)local_100);
    QVar4.stream = local_f8.stream;
    QVar12.m_data = (storage_type *)0xc;
    QVar12.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar12);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)&local_58);
    if ((QArrayData *)local_58.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58.shared = *(int *)local_58.shared + -1;
      UNLOCK();
      if (*(int *)local_58.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_58.shared,2,0x10);
      }
    }
    if (*(QTextStream *)(local_f8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_f8.stream,' ');
    }
    pQVar7 = (this->model).wp.value;
    (**(code **)(*(long *)pQVar7 + 0x90))(&local_58,pQVar7,parent,0);
    QVariant::toString();
    if (local_118 == (undefined8 *)0x0) {
      local_118 = &QString::_empty;
    }
    QDebug::putString((QChar *)(local_100 + 8),(ulong)local_118);
    if (*(QTextStream *)(local_f8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_f8.stream,' ');
    }
    QVar4.stream = local_f8.stream;
    QVar13.m_data = (storage_type *)0x18;
    QVar13.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar13);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)&local_78);
    if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_78.shared = *(int *)local_78.shared + -1;
      UNLOCK();
      if (*(int *)local_78.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_78.shared,2,0x10);
      }
    }
    if (*(QTextStream *)(local_f8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_f8.stream,' ');
    }
    pQVar7 = (this->model).wp.value;
    iVar6 = (**(code **)(*(long *)pQVar7 + 0x78))(pQVar7,parent);
    QTextStream::operator<<((QTextStream *)local_f8.stream,iVar6);
    if (*(QTextStream *)(local_f8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_f8.stream,' ');
    }
    QVar4.stream = local_f8.stream;
    QVar14.m_data = (storage_type *)0x16;
    QVar14.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar14);
    QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)&local_78);
    if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_78.shared = *(int *)local_78.shared + -1;
      UNLOCK();
      if (*(int *)local_78.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_78.shared,2,0x10);
      }
    }
    if (*(QTextStream *)(local_f8.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_f8.stream,' ');
    }
    local_f0._0_8_ = local_f8.stream;
    *(int *)(local_f8.stream + 0x28) = *(int *)(local_f8.stream + 0x28) + 1;
    pQVar7 = (this->model).wp.value;
    (**(code **)(*(long *)pQVar7 + 0x60))(local_138,pQVar7,start + -1,0,parent);
    operator<<((QDebug)&local_f0.i,(QModelIndex *)(local_100 + 0x10));
    pDVar1 = (this->model).wp.d;
    if ((pDVar1 == (Data *)0x0) || ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)
       ) {
      pQVar7 = (QObject *)0x0;
    }
    else {
      pQVar7 = (this->model).wp.value;
    }
    pQVar2 = (this->model).wp.value;
    (**(code **)(*(long *)pQVar2 + 0x60))(local_150,pQVar2,start + -1,0,parent);
    (**(code **)(*(long *)pQVar7 + 0x90))(&local_78,pQVar7,local_150,0);
    operator<<((QDebug *)&local_f0.m,(QVariant *)&local_f0.i);
    QDebug::~QDebug((QDebug *)&local_f0.m);
    QVariant::~QVariant((QVariant *)&local_78);
    QDebug::~QDebug((QDebug *)&local_f0.i);
    QDebug::~QDebug((QDebug *)(local_100 + 0x10));
    if (local_120 != (QArrayData *)0x0) {
      LOCK();
      (local_120->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_120->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_120->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_120,2,0x10);
      }
    }
    QVariant::~QVariant((QVariant *)&local_58);
    QDebug::~QDebug((QDebug *)(local_100 + 8));
    QDebug::~QDebug((QDebug *)local_100);
    QDebug::~QDebug(&local_108);
  }
  local_d8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8.shared = (PrivateShared *)0x0;
  local_b8._8_8_ = 0;
  local_b8._16_8_ = 0;
  uStack_a0 = 2;
  local_98.shared = (PrivateShared *)0x0;
  local_98._8_8_ = 0;
  local_98._16_8_ = 0;
  uStack_80 = 2;
  pQVar3 = (parent->m).ptr;
  local_d8._16_4_ = SUB84(pQVar3,0);
  local_d8._20_4_ = (undefined4)((ulong)pQVar3 >> 0x20);
  local_d8._0_4_ = parent->r;
  local_d8._4_4_ = parent->c;
  local_d8._8_4_ = (undefined4)parent->i;
  local_d8._12_4_ = *(undefined4 *)((long)&parent->i + 4);
  pQVar7 = (this->model).wp.value;
  iVar6 = (**(code **)(*(long *)pQVar7 + 0x78))(pQVar7,parent);
  local_d8._24_4_ = iVar6;
  if (start < 1) {
LAB_00149da7:
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    local_40 = 2;
  }
  else {
    pQVar7 = (this->model).wp.value;
    (**(code **)(*(long *)pQVar7 + 0x60))(&local_78,pQVar7,start + -1,0,parent);
    if ((long *)local_78._16_8_ == (long *)0x0) goto LAB_00149da7;
    (**(code **)(*(long *)local_78._16_8_ + 0x90))(&local_58,local_78._16_8_,&local_78,0);
  }
  QVariant::operator=((QVariant *)&local_b8,(QVariant *)&local_58);
  QVariant::~QVariant((QVariant *)&local_58);
  if (start < (int)local_d8._24_4_) {
    pQVar7 = (this->model).wp.value;
    (**(code **)(*(long *)pQVar7 + 0x60))(&local_78,pQVar7,start,0,parent);
    if ((long *)local_78._16_8_ == (long *)0x0) goto LAB_00149e3d;
    (**(code **)(*(long *)local_78._16_8_ + 0x90))(&local_58,local_78._16_8_,&local_78,0);
  }
  else {
LAB_00149e3d:
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    local_40 = 2;
  }
  QVariant::operator=((QVariant *)&local_98,(QVariant *)&local_58);
  QVariant::~QVariant((QVariant *)&local_58);
  QtPrivate::QGenericArrayOps<QAbstractItemModelTesterPrivate::Changing>::
  emplace<QAbstractItemModelTesterPrivate::Changing_const&>
            ((QGenericArrayOps<QAbstractItemModelTesterPrivate::Changing> *)&this->insert,
             (this->insert).super_QList<QAbstractItemModelTesterPrivate::Changing>.d.size,
             (Changing *)local_d8);
  QList<QAbstractItemModelTesterPrivate::Changing>::end
            (&(this->insert).super_QList<QAbstractItemModelTesterPrivate::Changing>);
  QVariant::~QVariant((QVariant *)&local_98);
  QVariant::~QVariant((QVariant *)&local_b8);
LAB_00149eb1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelTesterPrivate::rowsAboutToBeInserted(const QModelIndex &parent, int start, int end)
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::None);
    changeInFlight = ChangeInFlight::RowsInserted;

    qCDebug(lcModelTest) << "rowsAboutToBeInserted"
                         << "start=" << start << "end=" << end << "parent=" << parent
                         << "parent data=" << model->data(parent).toString()
                         << "current count of parent=" << model->rowCount(parent)
                         << "last before insertion=" << model->index(start - 1, 0, parent) << model->data(model->index(start - 1, 0, parent));

    Changing c;
    c.parent = parent;
    c.oldSize = model->rowCount(parent);
    c.last = (start - 1 >= 0) ? model->index(start - 1, 0, parent).data() : QVariant();
    c.next = (start < c.oldSize) ? model->index(start, 0, parent).data() : QVariant();
    insert.push(c);
}